

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.h
# Opt level: O0

void __thiscall prometheus::detail::CKMSQuantiles::~CKMSQuantiles(CKMSQuantiles *this)

{
  CKMSQuantiles *this_local;
  
  std::
  vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
  ::~vector(&this->sample_);
  return;
}

Assistant:

class PROMETHEUS_CPP_CORE_EXPORT CKMSQuantiles {
 public:
  struct PROMETHEUS_CPP_CORE_EXPORT Quantile {
    Quantile(double quantile, double error);

    double quantile;
    double error;
    double u;
    double v;
  }